

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_iso9660.c
# Opt level: O1

int iso9660AddEntry(PHYSFS_Io *io,int joliet,int isdir,char *base,PHYSFS_uint8 *fname,int fnamelen,
                   PHYSFS_sint64 ts,PHYSFS_uint64 pos,PHYSFS_uint64 len,void *unpkarc)

{
  PHYSFS_Io *io_00;
  int isdir_00;
  PHYSFS_uint16 PVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  void *pvVar6;
  undefined1 *puVar7;
  size_t len_00;
  PHYSFS_ErrorCode errcode;
  undefined1 *ptr;
  PHYSFS_uint16 *ucs2;
  size_t sVar8;
  ulong uVar9;
  undefined1 auStack_58 [8];
  PHYSFS_Io *local_50;
  size_t local_48;
  int local_40;
  int local_3c;
  char *local_38;
  
  puVar7 = auStack_58;
  if (fnamelen == 0) {
LAB_0011a1dc:
    errcode = PHYSFS_ERR_CORRUPT;
  }
  else {
    if ((fnamelen == 1) && (*fname < 2)) {
      return 1;
    }
    if (joliet == 0) {
      iVar2 = 1;
    }
    else {
      iVar2 = 2;
      puVar7 = auStack_58;
      if ((fnamelen & 1U) != 0) goto LAB_0011a1dc;
    }
    local_50 = io;
    local_40 = joliet;
    local_3c = isdir;
    sVar3 = strlen(base);
    uVar9 = (ulong)(uint)(iVar2 * fnamelen);
    len_00 = sVar3 + uVar9 + 2;
    if (len_00 < 0x100) {
      ptr = auStack_58 + -(sVar3 + uVar9 + 0x19 & 0xfffffffffffffff0);
      puVar7 = ptr;
    }
    else {
      ptr = (undefined1 *)0x0;
      puVar7 = auStack_58;
    }
    local_48 = len_00;
    *(undefined8 *)(puVar7 + -8) = 0x11a249;
    pcVar4 = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
    sVar8 = local_48;
    local_38 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      if (sVar3 != 0) {
        *(undefined8 *)(puVar7 + -8) = 0x11a270;
        snprintf(pcVar4,sVar8,"%s/");
        pcVar4 = local_38 + sVar3 + 1;
        sVar8 = uVar9 + 3;
      }
      if (local_40 == 0) {
        if (0 < fnamelen) {
          uVar9 = 0;
          do {
            if ((char)fname[uVar9] < '\0') goto LAB_0011a1dc;
            pcVar4[uVar9] = fname[uVar9];
            uVar9 = uVar9 + 1;
          } while ((uint)fnamelen != uVar9);
        }
        pcVar4[(uint)fnamelen] = '\0';
        if (local_3c == 0) {
          *(undefined8 *)(puVar7 + -8) = 0x11a316;
          pcVar5 = strrchr(pcVar4,0x3b);
          if (pcVar5 == pcVar4 || pcVar5 == (char *)0x0) {
            pcVar4 = pcVar4 + (fnamelen - 1);
          }
          else {
            pcVar4 = pcVar5 + -1;
            *pcVar5 = '\0';
          }
          if (*pcVar4 == '.') {
            *pcVar4 = '\0';
          }
        }
      }
      else {
        local_48 = sVar8;
        if (1 < (uint)fnamelen) {
          uVar9 = 0;
          do {
            PVar1 = *(PHYSFS_uint16 *)(fname + uVar9 * 2);
            *(undefined8 *)(puVar7 + -8) = 0x11a2b7;
            PVar1 = PHYSFS_swapUBE16(PVar1);
            *(PHYSFS_uint16 *)(fname + uVar9 * 2) = PVar1;
            uVar9 = uVar9 + 1;
          } while ((uint)fnamelen >> 1 != uVar9);
        }
        sVar3 = local_48;
        (fname + (ulong)((uint)fnamelen >> 1) * 2)[0] = '\0';
        (fname + (ulong)((uint)fnamelen >> 1) * 2)[1] = '\0';
        *(undefined8 *)(puVar7 + -8) = 0x11a2da;
        PHYSFS_utf8FromUcs2((PHYSFS_uint16 *)fname,pcVar4,sVar3);
      }
      pcVar4 = local_38;
      isdir_00 = local_3c;
      *(PHYSFS_uint64 *)(puVar7 + -0x10) = len;
      *(undefined8 *)(puVar7 + -0x18) = 0x11a372;
      pvVar6 = UNPK_addEntry(unpkarc,pcVar4,isdir_00,ts,ts,pos,*(PHYSFS_uint64 *)(puVar7 + -0x10));
      pcVar4 = local_38;
      iVar2 = local_40;
      io_00 = local_50;
      if ((isdir_00 != 0) && (pvVar6 != (void *)0x0)) {
        *(undefined8 *)(puVar7 + -8) = 0x11a39f;
        iVar2 = iso9660LoadEntries(io_00,iVar2,pcVar4,pos,len + pos,unpkarc);
        if (iVar2 == 0) {
          pvVar6 = (void *)0x0;
        }
      }
      pcVar4 = local_38;
      *(undefined8 *)(puVar7 + -8) = 0x11a3b0;
      __PHYSFS_smallFree(pcVar4);
      return (uint)(pvVar6 != (void *)0x0);
    }
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  *(undefined8 *)(puVar7 + -8) = 0x11a1e6;
  PHYSFS_setErrorCode(errcode);
  return 0;
}

Assistant:

static int iso9660AddEntry(PHYSFS_Io *io, const int joliet, const int isdir,
                           const char *base, PHYSFS_uint8 *fname,
                           const int fnamelen, const PHYSFS_sint64 ts,
                           const PHYSFS_uint64 pos, const PHYSFS_uint64 len,
                           void *unpkarc)
{
    char *fullpath;
    char *fnamecpy;
    size_t baselen;
    size_t fullpathlen;
    void *entry;
    int i;

    if (fnamelen == 1 && ((fname[0] == 0) || (fname[0] == 1)))
        return 1;  /* Magic that represents "." and "..", ignore */

    BAIL_IF(fnamelen == 0, PHYSFS_ERR_CORRUPT, 0);
    assert(fnamelen > 0);
    assert(fnamelen <= 255);
    BAIL_IF(joliet && (fnamelen % 2), PHYSFS_ERR_CORRUPT, 0);

    /* Joliet is UCS-2, so at most UTF-8 will double the byte size */
    baselen = strlen(base);
    fullpathlen = baselen + (fnamelen * (joliet ? 2 : 1)) + 2;
    fullpath = (char *) __PHYSFS_smallAlloc(fullpathlen);
    BAIL_IF(!fullpath, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    fnamecpy = fullpath;
    if (baselen > 0)
    {
        snprintf(fullpath, fullpathlen, "%s/", base);
        fnamecpy += baselen + 1;
        fullpathlen -= baselen - 1;
    } /* if */

    if (joliet)
    {
        PHYSFS_uint16 *ucs2 = (PHYSFS_uint16 *) fname;
        int total = fnamelen / 2;
        for (i = 0; i < total; i++)
            ucs2[i] = PHYSFS_swapUBE16(ucs2[i]);
        ucs2[total] = '\0';
        PHYSFS_utf8FromUcs2(ucs2, fnamecpy, fullpathlen);
    } /* if */
    else
    {
        for (i = 0; i < fnamelen; i++)
        {
            /* We assume the filenames are low-ASCII; consider the archive
               corrupt if we see something above 127, since we don't know the
               encoding. (We can change this later if we find out these exist
               and are intended to be, say, latin-1 or UTF-8 encoding). */
            BAIL_IF(fname[i] > 127, PHYSFS_ERR_CORRUPT, 0);
            fnamecpy[i] = fname[i];
        } /* for */
        fnamecpy[fnamelen] = '\0';

        if (!isdir)
        {
            /* find last SEPARATOR2 */
            char *ptr = strrchr(fnamecpy, ';');
            if (ptr && (ptr != fnamecpy))
                *(ptr--) = '\0';
            else
                ptr = fnamecpy + (fnamelen - 1);

            /* chop out any trailing '.', as done in all implementations */
            if (*ptr == '.')
                *ptr = '\0';
        } /* if */
    } /* else */

    entry = UNPK_addEntry(unpkarc, fullpath, isdir, ts, ts, pos, len);
    if ((entry) && (isdir))
    {
        if (!iso9660LoadEntries(io, joliet, fullpath, pos, pos + len, unpkarc))
            entry = NULL;  /* so we report a failure later. */
    } /* if */

    __PHYSFS_smallFree(fullpath);
    return entry != NULL;
}